

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O0

void __thiscall ParseInt8_Both_Test::~ParseInt8_Both_Test(ParseInt8_Both_Test *this)

{
  ParseInt8_Both_Test *this_local;
  
  ~ParseInt8_Both_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParseInt8, Both) {
  AssertInt8Equals(0, "0");
  AssertInt8Equals(100, "100");
  AssertInt8Equals(123, "123");
  AssertInt8Equals(127, "127");
  AssertInt8Equals(255, "255");
  AssertInt8Equals(0xca, "0xca");
  AssertInt8Equals(0x7f, "0x7f");
  AssertInt8Equals(0x80, "0x80");
  AssertInt8Equals(0xff, "0xff");
}